

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitStructNew(OptimizeInstructions *this,StructNew *curr)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  ulong uVar4;
  const_reference pvVar5;
  Expression **ppEVar6;
  Expression *rep_00;
  bool local_c1;
  bool local_a1;
  Expression *rep;
  Literal local_80;
  byte local_61;
  Literal local_60;
  Expression *local_48;
  Expression *value;
  Type type;
  HeapType HStack_30;
  Index i;
  Struct *local_28;
  FieldList *fields;
  StructNew *local_18;
  StructNew *curr_local;
  OptimizeInstructions *this_local;
  
  fields._4_4_ = 1;
  local_18 = curr;
  curr_local = (StructNew *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.
                      type,(BasicType *)((long)&fields + 4));
  local_a1 = true;
  if (!bVar1) {
    local_a1 = StructNew::isWithDefault(local_18);
  }
  if (local_a1 == false) {
    HStack_30 = wasm::Type::getHeapType
                          (&(local_18->super_SpecificExpression<(wasm::Expression::Id)65>).
                            super_Expression.type);
    local_28 = HeapType::getStruct(&stack0xffffffffffffffd0);
    sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_28->fields);
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(local_18->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    if (sVar2 != sVar3) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x726,"void wasm::OptimizeInstructions::visitStructNew(StructNew *)");
    }
    for (type.id._4_4_ = 0; uVar4 = (ulong)type.id._4_4_,
        sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_28->fields),
        uVar4 < sVar2; type.id._4_4_ = type.id._4_4_ + 1) {
      pvVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                         (&local_28->fields,(ulong)type.id._4_4_);
      value = (Expression *)(pvVar5->type).id;
      bVar1 = wasm::Type::isDefaultable((Type *)&value);
      if (!bVar1) {
        return;
      }
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_18->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)type.id._4_4_);
      local_48 = getFallthrough(this,*ppEVar6);
      bVar1 = Properties::isSingleConstantExpression(local_48);
      local_61 = 0;
      local_c1 = true;
      if (bVar1) {
        Properties::getLiteral(&local_60,local_48);
        local_61 = 1;
        wasm::Literal::makeZero(&local_80,(Type)value);
        local_c1 = wasm::Literal::operator!=(&local_60,&local_80);
        wasm::Literal::~Literal(&local_80);
      }
      if ((local_61 & 1) != 0) {
        wasm::Literal::~Literal(&local_60);
      }
      if (local_c1 != false) {
        return;
      }
    }
    rep_00 = getDroppedChildrenAndAppend(this,(Expression *)local_18,(Expression *)local_18);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::clear
              (&(local_18->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    bVar1 = StructNew::isWithDefault(local_18);
    if (!bVar1) {
      __assert_fail("curr->isWithDefault()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x73a,"void wasm::OptimizeInstructions::visitStructNew(StructNew *)");
    }
    replaceCurrent(this,rep_00);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    // If values are provided, but they are all the default, then we can remove
    // them (in reachable code).
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());

    for (Index i = 0; i < fields.size(); i++) {
      // The field must be defaultable.
      auto type = fields[i].type;
      if (!type.isDefaultable()) {
        return;
      }

      // The field must be written the default value.
      auto* value = getFallthrough(curr->operands[i]);
      if (!Properties::isSingleConstantExpression(value) ||
          Properties::getLiteral(value) != Literal::makeZero(type)) {
        return;
      }
    }

    // Success! Drop the children and return a struct.new_with_default.
    auto* rep = getDroppedChildrenAndAppend(curr, curr);
    curr->operands.clear();
    assert(curr->isWithDefault());
    replaceCurrent(rep);
  }